

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

Transliterator * __thiscall
icu_63::Transliterator::getElement(Transliterator *this,int32_t index,UErrorCode *ec)

{
  int iVar1;
  long *plVar2;
  Transliterator *pTVar3;
  
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    plVar2 = (long *)__dynamic_cast(this,&typeinfo,&CompoundTransliterator::typeinfo,0);
    if (plVar2 == (long *)0x0) {
      iVar1 = 1;
    }
    else {
      iVar1 = (**(code **)(*plVar2 + 0x88))(plVar2);
    }
    if ((index < 0) || (iVar1 <= index)) {
      *ec = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else if (iVar1 != 1) {
      pTVar3 = (Transliterator *)(**(code **)(*plVar2 + 0x90))(plVar2,index);
      return pTVar3;
    }
  }
  return this;
}

Assistant:

const Transliterator& Transliterator::getElement(int32_t index, UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return *this;
    }
    const CompoundTransliterator* cpd = dynamic_cast<const CompoundTransliterator*>(this);
    int32_t n = (cpd == NULL) ? 1 : cpd->getCount();
    if (index < 0 || index >= n) {
        ec = U_INDEX_OUTOFBOUNDS_ERROR;
        return *this;
    } else {
        return (n == 1) ? *this : cpd->getTransliterator(index);
    }
}